

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O2

DdNode * Cudd_addMinus(DdManager *dd,DdNode **f,DdNode **g)

{
  int *piVar1;
  DdNode *f_00;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *data;
  
  pDVar2 = *f;
  f_00 = *g;
  pDVar3 = dd->zero;
  if (pDVar2 != f_00) {
    if (pDVar2 == pDVar3) {
      if (f_00->index == 0x7fffffff) {
        pDVar2 = cuddUniqueConst(dd,-(double)(f_00->type).kids.T);
        return pDVar2;
      }
      pDVar2 = cuddCacheLookup1(dd,Cudd_addNegate,f_00);
      if (pDVar2 == (DdNode *)0x0) {
        pDVar2 = (f_00->type).kids.E;
        pDVar3 = cuddAddNegateRecur(dd,(f_00->type).kids.T);
        if (pDVar3 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar2 = cuddAddNegateRecur(dd,pDVar2);
          if (pDVar2 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            data = pDVar3;
            if ((pDVar3 == pDVar2) ||
               (data = cuddUniqueInter(dd,f_00->index,pDVar3,pDVar2), data != (DdNode *)0x0)) {
              piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              cuddCacheInsert1(dd,Cudd_addNegate,f_00,data);
              return data;
            }
            Cudd_RecursiveDeref(dd,pDVar3);
            pDVar3 = pDVar2;
          }
          Cudd_RecursiveDeref(dd,pDVar3);
        }
        pDVar2 = (DdNode *)0x0;
      }
      return pDVar2;
    }
    if (f_00 == pDVar3) {
      return pDVar2;
    }
    if ((pDVar2->index == 0x7fffffff) && (f_00->index == 0x7fffffff)) {
      pDVar2 = cuddUniqueConst(dd,(pDVar2->type).value - (f_00->type).value);
      return pDVar2;
    }
    pDVar3 = (DdNode *)0x0;
  }
  return pDVar3;
}

Assistant:

DdNode *
Cudd_addMinus(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *res;
    DdNode *F, *G;
    CUDD_VALUE_TYPE value;

    F = *f; G = *g;
    if (F == G) return(DD_ZERO(dd));
    if (F == DD_ZERO(dd)) return(cuddAddNegateRecur(dd,G));
    if (G == DD_ZERO(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        value = cuddV(F)-cuddV(G);
        res = cuddUniqueConst(dd,value);
        return(res);
    }
    return(NULL);

}